

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

ostream * docopt::operator<<(ostream *os,value *val)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  string *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  reference pbVar5;
  ostream *poVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *el;
  const_iterator __end5;
  const_iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  bool first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list;
  string *str;
  long v;
  bool b;
  value *val_local;
  ostream *os_local;
  
  bVar1 = value::isBool(val);
  if (bVar1) {
    bVar1 = value::asBool(val);
    pcVar7 = "false";
    if (bVar1) {
      pcVar7 = "true";
    }
    std::operator<<(os,pcVar7);
  }
  else {
    bVar1 = value::isLong(val);
    if (bVar1) {
      lVar3 = value::asLong(val);
      std::ostream::operator<<(os,lVar3);
    }
    else {
      bVar1 = value::isString(val);
      if (bVar1) {
        psVar4 = value::asString_abi_cxx11_(val);
        poVar6 = std::operator<<(os,'\"');
        poVar6 = std::operator<<(poVar6,(string *)psVar4);
        std::operator<<(poVar6,'\"');
      }
      else {
        bVar1 = value::isStringList(val);
        if (bVar1) {
          this = value::asStringList_abi_cxx11_(val);
          std::operator<<(os,"[");
          bVar1 = true;
          __end5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(this);
          el = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(this);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&el), bVar2) {
            pbVar5 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&__end5);
            if (bVar1) {
              bVar1 = false;
            }
            else {
              std::operator<<(os,", ");
            }
            poVar6 = std::operator<<(os,'\"');
            poVar6 = std::operator<<(poVar6,(string *)pbVar5);
            std::operator<<(poVar6,'\"');
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end5);
          }
          std::operator<<(os,"]");
        }
        else {
          std::operator<<(os,"null");
        }
      }
    }
  }
  return os;
}

Assistant:

DOCOPT_INLINE
std::ostream& docopt::operator<<(std::ostream& os, value const& val)
{
	if (val.isBool()) {
		bool b = val.asBool();
		os << (b ? "true" : "false");
	} else if (val.isLong()) {
		long v = val.asLong();
		os << v;
	} else if (val.isString()) {
		std::string const& str = val.asString();
		os << '"' << str << '"';
	} else if (val.isStringList()) {
		auto const& list = val.asStringList();
		os << "[";
		bool first = true;
		for(auto const& el : list) {
			if (first) {
				first = false;
			} else {
				os << ", ";
			}
			os << '"' << el << '"';
		}
		os << "]";
	} else {
		os << "null";
	}
	return os;
}